

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderModifier.cpp
# Opt level: O1

void __thiscall
Assimp::Blender::BlenderModifierShowcase::ApplyModifiers
          (BlenderModifierShowcase *this,aiNode *out,ConversionData *conv_data,Scene *in,
          Object *orig_object)

{
  BlenderModifier *pBVar1;
  FileDatabase *pFVar2;
  BlenderModifier *pBVar3;
  vector<Assimp::Blender::BlenderModifier*,std::allocator<Assimp::Blender::BlenderModifier*>>
  *pvVar4;
  int iVar5;
  const_iterator cVar6;
  Logger *pLVar7;
  code *pcVar8;
  size_t sVar9;
  pointer pSVar10;
  pointer ppBVar11;
  element_type *peVar12;
  char *pcVar13;
  long lVar14;
  long lVar15;
  fpCreateModifier *pp_Var16;
  long *local_210 [2];
  long local_200 [2];
  long local_1f0;
  ConversionData *local_1e8;
  long local_1e0;
  vector<Assimp::Blender::BlenderModifier*,std::allocator<Assimp::Blender::BlenderModifier*>>
  *local_1d8;
  Object *local_1d0;
  pointer local_1c8;
  aiNode *local_1c0;
  Scene *local_1b8;
  element_type *local_1b0;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  peVar12 = (orig_object->modifiers).first.
            super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1e8 = conv_data;
  local_1d8 = (vector<Assimp::Blender::BlenderModifier*,std::allocator<Assimp::Blender::BlenderModifier*>>
               *)this;
  local_1d0 = orig_object;
  local_1c0 = out;
  local_1b8 = in;
  if (peVar12 == (element_type *)0x0) {
    lVar14 = 0;
    local_1f0 = 0;
  }
  else {
    pBVar1 = (BlenderModifier *)(local_1a8 + 0x10);
    local_1f0 = 0;
    lVar14 = 0;
    do {
      if (peVar12->dna_type == (char *)0x0) {
        __assert_fail("cur->dna_type",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Blender/BlenderModifier.cpp"
                      ,0x5a,
                      "void Assimp::Blender::BlenderModifierShowcase::ApplyModifiers(aiNode &, ConversionData &, const Scene &, const Object &)"
                     );
      }
      pFVar2 = local_1e8->db;
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,peVar12->dna_type,(allocator<char> *)local_210);
      cVar6 = ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              ::find(&(pFVar2->dna).indices._M_t,(key_type *)local_1a8);
      if ((_Rb_tree_header *)cVar6._M_node ==
          &(pFVar2->dna).indices._M_t._M_impl.super__Rb_tree_header) {
        pSVar10 = (pointer)0x0;
      }
      else {
        pSVar10 = (pFVar2->dna).structures.
                  super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
                  .
                  super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
                  ._M_impl.super__Vector_impl_data._M_start + *(long *)(cVar6._M_node + 2);
      }
      if ((BlenderModifier *)local_1a8._0_8_ != pBVar1) {
        operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
      }
      if (pSVar10 == (pointer)0x0) {
        pLVar7 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[44]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8
                   ,(char (*) [44])"BlendModifier: could not resolve DNA name: ");
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a8,
                   &peVar12->dna_type);
        ::std::__cxx11::stringbuf::str();
        Logger::warn(pLVar7,(char *)local_210[0]);
LAB_004df0a6:
        if (local_210[0] != local_200) {
          operator_delete(local_210[0],local_200[0] + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        ::std::ios_base::~ios_base(local_138);
      }
      else {
        local_1a8._0_8_ = pBVar1;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"modifier","");
        cVar6 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                ::find(&(pSVar10->indices)._M_t,(key_type *)local_1a8);
        if ((_Rb_tree_header *)cVar6._M_node ==
            &(pSVar10->indices)._M_t._M_impl.super__Rb_tree_header) {
          lVar15 = 0;
        }
        else {
          lVar15 = *(long *)(cVar6._M_node + 2) * 0x68 +
                   *(long *)&(pSVar10->fields).
                             super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>
                             .
                             super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>
          ;
        }
        if ((BlenderModifier *)local_1a8._0_8_ != pBVar1) {
          operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
        }
        if ((lVar15 == 0) || (*(long *)(lVar15 + 0x48) != 0)) {
          pLVar7 = DefaultLogger::get();
          pcVar13 = "BlendModifier: expected a `modifier` member at offset 0";
        }
        else {
          pFVar2 = local_1e8->db;
          cVar6 = ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  ::find(&(pFVar2->dna).indices._M_t,(key_type *)(lVar15 + 0x20));
          if ((_Rb_tree_header *)cVar6._M_node ==
              &(pFVar2->dna).indices._M_t._M_impl.super__Rb_tree_header) {
            pSVar10 = (pointer)0x0;
          }
          else {
            pSVar10 = (pFVar2->dna).structures.
                      super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
                      .
                      super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
                      ._M_impl.super__Vector_impl_data._M_start + *(long *)(cVar6._M_node + 2);
          }
          if ((pSVar10 != (pointer)0x0) &&
             (iVar5 = ::std::__cxx11::string::compare((char *)pSVar10), iVar5 == 0)) {
            local_1b0 = peVar12 + 1;
            ppBVar11 = *(pointer *)local_1d8;
            local_1c8 = *(pointer *)(local_1d8 + 8);
            pcVar8 = god<Assimp::Blender::BlenderModifier_Mirror>;
            pp_Var16 = creators;
            local_1e0 = lVar14;
            do {
              if (ppBVar11 == local_1c8) {
                local_1a8._0_8_ = (*pcVar8)();
                pvVar4 = local_1d8;
                ::std::
                vector<Assimp::Blender::BlenderModifier*,std::allocator<Assimp::Blender::BlenderModifier*>>
                ::emplace_back<Assimp::Blender::BlenderModifier*>
                          (local_1d8,(BlenderModifier **)local_1a8);
                local_1c8 = *(pointer *)(pvVar4 + 8);
                ppBVar11 = local_1c8 + -1;
              }
              pBVar3 = *ppBVar11;
              iVar5 = (*pBVar3->_vptr_BlenderModifier[2])(pBVar3,local_1b0);
              if ((char)iVar5 != '\0') {
                (*pBVar3->_vptr_BlenderModifier[3])
                          (pBVar3,local_1c0,local_1e8,peVar12,local_1b8,local_1d0);
                local_1f0 = local_1f0 + 1;
                pp_Var16 = (fpCreateModifier *)0x0;
                break;
              }
              ppBVar11 = ppBVar11 + 1;
              pcVar8 = pp_Var16[1];
              pp_Var16 = pp_Var16 + 1;
            } while (pcVar8 != (fpCreateModifier)0x0);
            lVar14 = local_1e0;
            if (pp_Var16 != (fpCreateModifier *)0x0) {
              pLVar7 = DefaultLogger::get();
              Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
              basic_formatter<char[39]>
                        ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a8,(char (*) [39])"Couldn\'t find a handler for modifier: ");
              sVar9 = strlen((char *)&peVar12[4].dna_type);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)&peVar12[4].dna_type,sVar9);
              lVar14 = local_1e0;
              ::std::__cxx11::stringbuf::str();
              Logger::warn(pLVar7,(char *)local_210[0]);
              goto LAB_004df0a6;
            }
            goto LAB_004df122;
          }
          pLVar7 = DefaultLogger::get();
          pcVar13 = "BlendModifier: expected a ModifierData structure as first member";
        }
        Logger::warn(pLVar7,pcVar13);
      }
LAB_004df122:
      lVar14 = lVar14 + 1;
      peVar12 = (element_type *)peVar12[2]._vptr_ElemBase;
    } while (peVar12 != (element_type *)0x0);
  }
  if (lVar14 != 0) {
    pLVar7 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[35]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [35])"BlendModifier: found handlers for ");
    ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," of ",4);
    ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," modifiers on `",0xf)
    ;
    pcVar13 = (local_1d0->id).name;
    sVar9 = strlen(pcVar13);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar13,sVar9);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"`, check log messages above for errors",0x26);
    ::std::__cxx11::stringbuf::str();
    Logger::debug(pLVar7,(char *)local_210[0]);
    if (local_210[0] != local_200) {
      operator_delete(local_210[0],local_200[0] + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    ::std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

void BlenderModifierShowcase::ApplyModifiers(aiNode& out, ConversionData& conv_data, const Scene& in, const Object& orig_object )
{
    size_t cnt = 0u, ful = 0u;

    // NOTE: this cast is potentially unsafe by design, so we need to perform type checks before
    // we're allowed to dereference the pointers without risking to crash. We might still be
    // invoking UB btw - we're assuming that the ModifierData member of the respective modifier
    // structures is at offset sizeof(vftable) with no padding.
    const SharedModifierData* cur = static_cast<const SharedModifierData *> ( orig_object.modifiers.first.get() );
    for (; cur; cur =  static_cast<const SharedModifierData *> ( cur->modifier.next.get() ), ++ful) {
        ai_assert(cur->dna_type);

        const Structure* s = conv_data.db.dna.Get( cur->dna_type );
        if (!s) {
            ASSIMP_LOG_WARN_F("BlendModifier: could not resolve DNA name: ",cur->dna_type);
            continue;
        }

        // this is a common trait of all XXXMirrorData structures in BlenderDNA
        const Field* f = s->Get("modifier");
        if (!f || f->offset != 0) {
            ASSIMP_LOG_WARN("BlendModifier: expected a `modifier` member at offset 0");
            continue;
        }

        s = conv_data.db.dna.Get( f->type );
        if (!s || s->name != "ModifierData") {
            ASSIMP_LOG_WARN("BlendModifier: expected a ModifierData structure as first member");
            continue;
        }

        // now, we can be sure that we should be fine to dereference *cur* as
        // ModifierData (with the above note).
        const ModifierData& dat = cur->modifier;

        const fpCreateModifier* curgod = creators;
        std::vector< BlenderModifier* >::iterator curmod = cached_modifiers->begin(), endmod = cached_modifiers->end();

        for (;*curgod;++curgod,++curmod) { // allocate modifiers on the fly
            if (curmod == endmod) {
                cached_modifiers->push_back((*curgod)());

                endmod = cached_modifiers->end();
                curmod = endmod-1;
            }

            BlenderModifier* const modifier = *curmod;
            if(modifier->IsActive(dat)) {
                modifier->DoIt(out,conv_data,*static_cast<const ElemBase *>(cur),in,orig_object);
                cnt++;

                curgod = NULL;
                break;
            }
        }
        if (curgod) {
            ASSIMP_LOG_WARN_F("Couldn't find a handler for modifier: ",dat.name);
        }
    }

    // Even though we managed to resolve some or all of the modifiers on this
    // object, we still can't say whether our modifier implementations were
    // able to fully do their job.
    if (ful) {
        ASSIMP_LOG_DEBUG_F("BlendModifier: found handlers for ",cnt," of ",ful," modifiers on `",orig_object.id.name,
            "`, check log messages above for errors");
    }
}